

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

string * __thiscall
embree::SceneGraphFlattener::makeUniqueID
          (string *__return_storage_ptr__,SceneGraphFlattener *this,string *id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer pcVar3;
  bool bVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  iterator iVar8;
  mapped_type_conflict *pmVar9;
  undefined8 *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint __len;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  iVar7 = std::__cxx11::string::compare((char *)id);
  if (iVar7 == 0) {
    std::__cxx11::string::_M_replace((ulong)id,0,(char *)id->_M_string_length,0x258d37);
  }
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->unique_id)._M_t,id);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->unique_id,id);
  if ((_Rb_tree_header *)iVar8._M_node == &(this->unique_id)._M_t._M_impl.super__Rb_tree_header) {
    *pmVar9 = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (id->_M_dataplus)._M_p;
    paVar1 = &id->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar5 = *(undefined8 *)((long)&id->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = id->_M_string_length;
    (id->_M_dataplus)._M_p = (pointer)paVar1;
    id->_M_string_length = 0;
    (id->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  uVar13 = (long)*pmVar9 + 1;
  *pmVar9 = (mapped_type_conflict)uVar13;
  pcVar3 = (id->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + id->_M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  uVar12 = -uVar13;
  if (0 < (long)uVar13) {
    uVar12 = uVar13;
  }
  __len = 1;
  if (9 < uVar12) {
    uVar11 = uVar12;
    uVar6 = 4;
    do {
      __len = uVar6;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_00173a1b;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_00173a1b;
      }
      if (uVar11 < 10000) goto LAB_00173a1b;
      bVar4 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      uVar6 = __len + 4;
    } while (bVar4);
    __len = __len + 1;
  }
LAB_00173a1b:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((long)uVar13 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_70 - ((long)uVar13 >> 0x3f)),__len,uVar12);
  uVar12 = 0xf;
  if (local_50 != local_40) {
    uVar12 = local_40[0];
  }
  if (uVar12 < (ulong)(local_68 + local_48)) {
    uVar12 = 0xf;
    if (local_70 != local_60) {
      uVar12 = local_60[0];
    }
    if ((ulong)(local_68 + local_48) <= uVar12) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_00173aaa;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
LAB_00173aaa:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar10 + 2;
  if ((size_type *)*puVar10 == psVar2) {
    uVar5 = puVar10[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar10;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar10[1];
  *puVar10 = psVar2;
  puVar10[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string makeUniqueID(std::string id) 
    {
      if (id == "") id = "camera";
      std::map<std::string,int>::iterator i = unique_id.find(id);
      if (i == unique_id.end()) {
        unique_id[id] = 0;
        return id;
      }
      else {
        int n = ++unique_id[id];
        return id + "_" + toString(n);
      }
    }